

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_Basic_Test::TestBody(QUICMethodTest_Basic_Test *this)

{
  SSL_SESSION *session_00;
  bool bVar1;
  internal iVar2;
  int iVar3;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  char *message;
  char *in_R9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  UniquePtr<SSL_SESSION> session;
  Span<const_unsigned_char> read_secret;
  Span<const_unsigned_char> write_secret;
  SSL_QUIC_METHOD quic_method;
  AssertHelper local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  Span<const_unsigned_char> local_58;
  AssertHelper local_40;
  SSL_QUIC_METHOD local_38;
  
  local_38.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  local_38.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  local_38.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  local_38.flush_flight = QUICMethodTest::FlushFlightCallback;
  local_38.send_alert = QUICMethodTest::SendAlertCallback;
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(pointer)0x0);
  SSL_CTX_set_session_cache_mode
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_sess_set_new_cb
            ((SSL_CTX *)
             (this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,SaveLastSession);
  iVar3 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
  iVar2 = (internal)(iVar3 != 0);
  pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68[0] = iVar2;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1cae,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_58);
  }
  else {
    iVar3 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
    local_68[0] = (internal)(iVar3 != 0);
    pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1caf,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_58);
    }
    else {
      local_68[0] = (internal)QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
      pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_68[0]) {
        local_68[0] = (internal)
                      QUICMethodTest::RunQUICHandshakesAndExpectError
                                (&this->super_QUICMethodTest,kNoError);
        pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_68[0]) {
          QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
          iVar3 = SSL_session_reused((this->super_QUICMethodTest).client_._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          local_68[0] = (internal)(iVar3 == 0);
          pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_68[0]) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)local_68,
                       (AssertionResult *)"SSL_session_reused(client_.get())","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cb5,(char *)CONCAT71(local_88._1_7_,local_88[0]));
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_88._1_7_,local_88[0]),
                              local_78._M_allocated_capacity + 1);
            }
            if ((long *)local_58.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_58.data_ + 8))();
            }
            if (pbStack_60 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_60,pbStack_60);
            }
          }
          iVar3 = SSL_session_reused((this->super_QUICMethodTest).server_._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          local_68[0] = (internal)(iVar3 == 0);
          pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar3 != 0) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)local_68,
                       (AssertionResult *)"SSL_session_reused(server_.get())","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cb6,(char *)CONCAT71(local_88._1_7_,local_88[0]));
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_88._1_7_,local_88[0]),
                              local_78._M_allocated_capacity + 1);
            }
            if ((long *)local_58.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_58.data_ + 8))();
            }
            if (pbStack_60 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_60,pbStack_60);
            }
          }
          local_68[0] = (internal)0x0;
          local_68._1_7_ = 0;
          pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_58.data_ = (uchar *)0x0;
          local_58.size_ = 0;
          bVar1 = SSL_get_traffic_secrets
                            ((this->super_QUICMethodTest).client_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                             (Span<const_unsigned_char> *)local_68,&local_58);
          iVar2 = (internal)!bVar1;
          local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_a8.data_._0_1_ = iVar2;
          if (!(bool)iVar2) {
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)&local_a8,
                       (AssertionResult *)
                       "SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret)","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cbb,(char *)CONCAT71(local_88._1_7_,local_88[0]));
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_88._1_7_,local_88[0]),
                              local_78._M_allocated_capacity + 1);
            }
            if (local_90._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_90._M_head_impl + 8))();
            }
            if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a0,local_a0);
            }
          }
          bVar1 = SSL_get_traffic_secrets
                            ((this->super_QUICMethodTest).server_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                             (Span<const_unsigned_char> *)local_68,&local_58);
          local_a8.data_._0_1_ = (internal)!bVar1;
          local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_a8.data_._0_1_) {
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)&local_a8,
                       (AssertionResult *)
                       "SSL_get_traffic_secrets(server_.get(), &read_secret, &write_secret)","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cbd,(char *)CONCAT71(local_88._1_7_,local_88[0]));
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_88._1_7_,local_88[0]),
                              local_78._M_allocated_capacity + 1);
            }
            if (local_90._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_90._M_head_impl + 8))();
            }
            if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a0,local_a0);
            }
          }
          local_a8.data_._0_1_ =
               (internal)((anonymous_namespace)::g_last_session == (SSL_SESSION *)0x0);
          local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_a8.data_._0_1_) {
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)&local_a8,(AssertionResult *)"g_last_session",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cc0,(char *)CONCAT71(local_88._1_7_,local_88[0]));
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_88._1_7_,local_88[0]),
                              local_78._M_allocated_capacity + 1);
            }
            if (local_90._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_90._M_head_impl + 8))();
            }
            if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a0,local_a0);
            }
          }
          bVar1 = QUICMethodTest::ProvideHandshakeData
                            ((this->super_QUICMethodTest).client_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0xffffffffffffffff)
          ;
          local_a8.data_._0_4_ = CONCAT31(local_a8.data_._1_3_,bVar1);
          local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar1) {
            local_a8.data_._0_4_ =
                 SSL_process_quic_post_handshake
                           ((this->super_QUICMethodTest).client_._M_t.
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            local_90._M_head_impl._0_4_ = 1;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_88,"SSL_process_quic_post_handshake(client_.get())","1",
                       (int *)&local_a8,(int *)&local_90);
            if (local_88[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_a8);
              if (local_80 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                message = "";
              }
              else {
                message = (local_80->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_90,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1cc2,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_90,(Message *)&local_a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
              if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
              }
            }
            if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_80,local_80);
            }
            iVar2 = (internal)((anonymous_namespace)::g_last_session != (SSL_SESSION *)0x0);
            local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_a8.data_._0_1_ = iVar2;
            if (!(bool)iVar2) {
              testing::Message::Message((Message *)&local_90);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_88,(internal *)&local_a8,
                         (AssertionResult *)"g_last_session","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1cc3,(char *)CONCAT71(local_88._1_7_,local_88[0]));
              testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_88._1_7_,local_88[0]),
                                local_78._M_allocated_capacity + 1);
              }
              if (local_90._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_90._M_head_impl + 8))();
              }
              if (local_a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a0,local_a0);
              }
            }
            bVar1 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
            session_00 = (anonymous_namespace)::g_last_session;
            local_a8.data_._0_4_ = CONCAT31(local_a8.data_._1_3_,bVar1);
            local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar1) {
              local_90._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::g_last_session;
              (anonymous_namespace)::g_last_session = (SSL_SESSION *)0x0;
              SSL_set_session((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,session_00)
              ;
              iVar2 = (internal)
                      QUICMethodTest::RunQUICHandshakesAndExpectError
                                (&this->super_QUICMethodTest,kNoError);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_a8.data_._0_1_ = iVar2;
              if ((bool)iVar2) {
                QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
                iVar3 = SSL_session_reused((this->super_QUICMethodTest).client_._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                local_a8.data_._0_1_ = (internal)(iVar3 != 0);
                local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_a8.data_._0_1_) {
                  testing::Message::Message((Message *)&local_98);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_88,(internal *)&local_a8,
                             (AssertionResult *)"SSL_session_reused(client_.get())","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1ccd,(char *)CONCAT71(local_88._1_7_,local_88[0]));
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_98);
                  testing::internal::AssertHelper::~AssertHelper(&local_40);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_88._1_7_,local_88[0]),
                                    local_78._M_allocated_capacity + 1);
                  }
                  if (local_98.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_98.data_ + 8))();
                  }
                  if (local_a0 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a0,local_a0);
                  }
                }
                iVar3 = SSL_session_reused((this->super_QUICMethodTest).server_._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                local_a8.data_._0_1_ = (internal)(iVar3 != 0);
                local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if ((bool)local_a8.data_._0_1_) goto LAB_001b5b63;
                testing::Message::Message((Message *)&local_98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_88,(internal *)&local_a8,
                           (AssertionResult *)"SSL_session_reused(server_.get())","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_40,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1cce,(char *)CONCAT71(local_88._1_7_,local_88[0]));
                testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_98);
              }
              else {
                testing::Message::Message((Message *)&local_98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_88,(internal *)&local_a8,
                           (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_40,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1cca,(char *)CONCAT71(local_88._1_7_,local_88[0]));
                testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_98);
              }
              testing::internal::AssertHelper::~AssertHelper(&local_40);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_88._1_7_,local_88[0]),
                                local_78._M_allocated_capacity + 1);
              }
              if (local_98.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_98.data_ + 8))();
              }
              if (local_a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a0,local_a0);
              }
LAB_001b5b63:
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_90);
              return;
            }
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)&local_a8,
                       (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cc6,(char *)CONCAT71(local_88._1_7_,local_88[0]));
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
          }
          else {
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)&local_a8,
                       (AssertionResult *)"ProvideHandshakeData(client_.get())","false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cc1,(char *)CONCAT71(local_88._1_7_,local_88[0]));
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
          }
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0;
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          __ptr_00 = local_a0;
          if (local_90._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_90._M_head_impl + 8))();
            __ptr_00 = local_a0;
          }
          goto LAB_001b56d8;
        }
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_88,(internal *)local_68,
                   (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1cb2,(char *)CONCAT71(local_88._1_7_,local_88[0]));
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_58);
      }
      else {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_88,(internal *)local_68,
                   (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1cb1,(char *)CONCAT71(local_88._1_7_,local_88[0]));
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_58);
      }
    }
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pbStack_60;
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
  }
  __ptr_00 = pbStack_60;
  if ((long *)local_58.data_ != (long *)0x0) {
    (**(code **)(*(long *)local_58.data_ + 8))();
    __ptr_00 = pbStack_60;
  }
LAB_001b56d8:
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, Basic) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  g_last_session = nullptr;

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_sess_set_new_cb(client_ctx_.get(), SaveLastSession);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(CompleteHandshakesForQUIC());

  ExpectHandshakeSuccess();
  EXPECT_FALSE(SSL_session_reused(client_.get()));
  EXPECT_FALSE(SSL_session_reused(server_.get()));

  // SSL_get_traffic_secrets is not defined for QUIC.
  Span<const uint8_t> read_secret, write_secret;
  EXPECT_FALSE(
      SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret));
  EXPECT_FALSE(
      SSL_get_traffic_secrets(server_.get(), &read_secret, &write_secret));

  // The server sent NewSessionTicket messages in the handshake.
  EXPECT_FALSE(g_last_session);
  ASSERT_TRUE(ProvideHandshakeData(client_.get()));
  EXPECT_EQ(SSL_process_quic_post_handshake(client_.get()), 1);
  EXPECT_TRUE(g_last_session);

  // Create a second connection to verify resumption works.
  ASSERT_TRUE(CreateClientAndServer());
  bssl::UniquePtr<SSL_SESSION> session = std::move(g_last_session);
  SSL_set_session(client_.get(), session.get());

  ASSERT_TRUE(CompleteHandshakesForQUIC());

  ExpectHandshakeSuccess();
  EXPECT_TRUE(SSL_session_reused(client_.get()));
  EXPECT_TRUE(SSL_session_reused(server_.get()));
}